

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldStringAccessor::Swap
          (RepeatedPtrFieldStringAccessor *this,Field *data,RepeatedFieldAccessor *other_mutator,
          Field *other_data)

{
  int iVar1;
  Type *value;
  int iVar2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmp;
  RepeatedPtrFieldBase local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((RepeatedFieldAccessor *)this != other_mutator) {
    local_68.arena_ = (Arena *)0x0;
    local_68.current_size_ = 0;
    local_68.total_size_ = 0;
    local_68.rep_ = (Rep *)0x0;
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Swap((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&local_68,
           (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)data);
    iVar1 = (*other_mutator->_vptr_RepeatedFieldAccessor[3])(other_mutator,other_data);
    iVar2 = 0;
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
      RepeatedFieldAccessor::Get<std::__cxx11::string>(&local_50,other_mutator,other_data,iVar2);
      RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
                ((RepeatedFieldAccessor *)this,data,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    iVar1 = (*(this->
              super_RepeatedPtrFieldWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).super_RandomAccessRepeatedFieldAccessor.super_RepeatedFieldAccessor.
              _vptr_RepeatedFieldAccessor[3])(this,data);
    (*other_mutator->_vptr_RepeatedFieldAccessor[5])(other_mutator,other_data);
    iVar2 = 0;
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
      value = RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (&local_68,iVar2);
      RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
                (other_mutator,other_data,value);
    }
    RepeatedPtrFieldBase::
    Destroy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(&local_68);
    return;
  }
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Swap((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)data,(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)other_data);
  return;
}

Assistant:

virtual void Swap(
      Field* data,
      const internal::RepeatedFieldAccessor* other_mutator,
      Field* other_data) const {
    if (this == other_mutator) {
      MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
    } else {
      RepeatedPtrField<string> tmp;
      tmp.Swap(MutableRepeatedField(data));
      int other_size = other_mutator->Size(other_data);
      for (int i = 0; i < other_size; ++i) {
        Add<string>(data, other_mutator->Get<string>(other_data, i));
      }
      int size = Size(data);
      other_mutator->Clear(other_data);
      for (int i = 0; i < size; ++i) {
        other_mutator->Add<string>(other_data, tmp.Get(i));
      }
    }
  }